

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square.hpp
# Opt level: O2

mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
* __thiscall
ising::tc::
square<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
          (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
           *__return_storage_ptr__,tc *this,
          mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
          *Jx,mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
              *Jy)

{
  type_conflict1 tVar1;
  unsigned_long uVar2;
  runtime_error *this_00;
  code *pcVar3;
  undefined *puVar4;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  xn;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_728;
  pair<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_unsigned_long>
  local_6d8;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_678;
  get_type_at<fvar<mp_wrapper<number<cpp_dec_float<100U>_>_>,_1UL>,_sizeof___(Orders)> local_628;
  autodiff_fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_1UL>
  v;
  autodiff_fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_1UL>
  vn;
  func<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
  local_498;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_3f8;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_3a0;
  type local_350;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_300;
  type local_2b0;
  get_type_at<fvar<mp_wrapper<number<cpp_dec_float<100U>_>_>,_1UL>,_sizeof___(Orders)> local_260;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_210;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_1c0;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_170;
  type local_120;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_d0;
  get_type_at<fvar<mp_wrapper<number<cpp_dec_float<100U>_>_>,_1UL>,_sizeof___(Orders)> local_80;
  
  abs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
            ((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
              *)&v,(mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                    *)this);
  *(undefined8 *)(this + 0x30) = v.v._M_elems[0].base.m_backend.data._M_elems._48_8_;
  *(undefined8 *)(this + 0x38) = v.v._M_elems[0].base.m_backend.data._M_elems._56_8_;
  *(undefined8 *)(this + 0x20) = v.v._M_elems[0].base.m_backend.data._M_elems._32_8_;
  *(undefined8 *)(this + 0x28) = v.v._M_elems[0].base.m_backend.data._M_elems._40_8_;
  *(undefined8 *)(this + 0x10) = v.v._M_elems[0].base.m_backend.data._M_elems._16_8_;
  *(undefined8 *)(this + 0x18) = v.v._M_elems[0].base.m_backend.data._M_elems._24_8_;
  *(undefined8 *)this = v.v._M_elems[0].base.m_backend.data._M_elems._0_8_;
  *(undefined8 *)(this + 8) = v.v._M_elems[0].base.m_backend.data._M_elems._8_8_;
  *(int *)(this + 0x40) = v.v._M_elems[0].base.m_backend.exp;
  this[0x44] = (tc)v.v._M_elems[0].base.m_backend.neg;
  *(undefined8 *)(this + 0x48) = v.v._M_elems[0].base.m_backend._72_8_;
  abs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
            ((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
              *)&v,Jx);
  *(undefined8 *)((Jx->base).m_backend.data._M_elems + 0xc) =
       v.v._M_elems[0].base.m_backend.data._M_elems._48_8_;
  *(undefined8 *)((Jx->base).m_backend.data._M_elems + 0xe) =
       v.v._M_elems[0].base.m_backend.data._M_elems._56_8_;
  *(undefined8 *)((Jx->base).m_backend.data._M_elems + 8) =
       v.v._M_elems[0].base.m_backend.data._M_elems._32_8_;
  *(undefined8 *)((Jx->base).m_backend.data._M_elems + 10) =
       v.v._M_elems[0].base.m_backend.data._M_elems._40_8_;
  *(undefined8 *)((Jx->base).m_backend.data._M_elems + 4) =
       v.v._M_elems[0].base.m_backend.data._M_elems._16_8_;
  *(undefined8 *)((Jx->base).m_backend.data._M_elems + 6) =
       v.v._M_elems[0].base.m_backend.data._M_elems._24_8_;
  *(undefined8 *)(Jx->base).m_backend.data._M_elems =
       v.v._M_elems[0].base.m_backend.data._M_elems._0_8_;
  *(undefined8 *)((Jx->base).m_backend.data._M_elems + 2) =
       v.v._M_elems[0].base.m_backend.data._M_elems._8_8_;
  (Jx->base).m_backend.exp = v.v._M_elems[0].base.m_backend.exp;
  (Jx->base).m_backend.neg = v.v._M_elems[0].base.m_backend.neg;
  (Jx->base).m_backend.fpclass = v.v._M_elems[0].base.m_backend.fpclass;
  (Jx->base).m_backend.prec_elem = v.v._M_elems[0].base.m_backend.prec_elem;
  ::operator*((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
               *)&v,(mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                     *)this,Jx);
  vn.v._M_elems[0].base.m_backend.data._M_elems._0_8_ =
       (ulong)vn.v._M_elems[0].base.m_backend.data._M_elems[1] << 0x20;
  tVar1 = boost::multiprecision::operator<=
                    ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                      *)&v,(int *)&vn);
  if (tVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              ((invalid_argument *)this_00,"Jx * Jy should be non-zero");
    puVar4 = &std::invalid_argument::typeinfo;
    pcVar3 = std::invalid_argument::~invalid_argument;
  }
  else {
    local_498.Jx_.base.m_backend.data._M_elems._0_8_ = *(undefined8 *)this;
    local_498.Jx_.base.m_backend.data._M_elems._8_8_ = *(undefined8 *)(this + 8);
    local_498.Jx_.base.m_backend.data._M_elems._16_8_ = *(undefined8 *)(this + 0x10);
    local_498.Jx_.base.m_backend.data._M_elems._24_8_ = *(undefined8 *)(this + 0x18);
    local_498.Jx_.base.m_backend.data._M_elems._32_8_ = *(undefined8 *)(this + 0x20);
    local_498.Jx_.base.m_backend.data._M_elems._40_8_ = *(undefined8 *)(this + 0x28);
    local_498.Jx_.base.m_backend.data._M_elems._48_8_ = *(undefined8 *)(this + 0x30);
    local_498.Jx_.base.m_backend.data._M_elems._56_8_ = *(undefined8 *)(this + 0x38);
    local_498.Jx_.base.m_backend.exp = *(int *)(this + 0x40);
    local_498.Jx_.base.m_backend.neg = *(bool *)(this + 0x44);
    local_498.Jx_.base.m_backend._72_8_ = *(undefined8 *)(this + 0x48);
    local_498.Jy_.base.m_backend.data._M_elems._0_8_ =
         *(undefined8 *)(Jx->base).m_backend.data._M_elems;
    local_498.Jy_.base.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((Jx->base).m_backend.data._M_elems + 2);
    local_498.Jy_.base.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((Jx->base).m_backend.data._M_elems + 4);
    local_498.Jy_.base.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((Jx->base).m_backend.data._M_elems + 6);
    local_498.Jy_.base.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((Jx->base).m_backend.data._M_elems + 8);
    local_498.Jy_.base.m_backend.data._M_elems._40_8_ =
         *(undefined8 *)((Jx->base).m_backend.data._M_elems + 10);
    local_498.Jy_.base.m_backend.data._M_elems._48_8_ =
         *(undefined8 *)((Jx->base).m_backend.data._M_elems + 0xc);
    local_498.Jy_.base.m_backend.data._M_elems._56_8_ =
         *(undefined8 *)((Jx->base).m_backend.data._M_elems + 0xe);
    local_498.Jy_.base.m_backend.exp = (Jx->base).m_backend.exp;
    local_498.Jy_.base.m_backend.neg = (Jx->base).m_backend.neg;
    local_498.Jy_.base.m_backend.fpclass = (Jx->base).m_backend.fpclass;
    local_498.Jy_.base.m_backend.prec_elem = (Jx->base).m_backend.prec_elem;
    operator+(&local_3a0,
              (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
               *)this,Jx);
    ::operator*(&local_350,2,&local_3a0);
    ::operator/(&local_728,1,&local_350);
    local_3f8.base.m_backend.data._M_elems[0] = local_728.base.m_backend.data._M_elems[0];
    local_3f8.base.m_backend.data._M_elems[1] = local_728.base.m_backend.data._M_elems[1];
    local_3f8.base.m_backend.data._M_elems[2] = local_728.base.m_backend.data._M_elems[2];
    local_3f8.base.m_backend.data._M_elems[3] = local_728.base.m_backend.data._M_elems[3];
    local_3f8.base.m_backend.data._M_elems[4] = local_728.base.m_backend.data._M_elems[4];
    local_3f8.base.m_backend.data._M_elems[5] = local_728.base.m_backend.data._M_elems[5];
    local_3f8.base.m_backend.data._M_elems[6] = local_728.base.m_backend.data._M_elems[6];
    local_3f8.base.m_backend.data._M_elems[7] = local_728.base.m_backend.data._M_elems[7];
    local_3f8.base.m_backend.data._M_elems[8] = local_728.base.m_backend.data._M_elems[8];
    local_3f8.base.m_backend.data._M_elems[9] = local_728.base.m_backend.data._M_elems[9];
    local_3f8.base.m_backend.data._M_elems[10] = local_728.base.m_backend.data._M_elems[10];
    local_3f8.base.m_backend.data._M_elems[0xb] = local_728.base.m_backend.data._M_elems[0xb];
    local_3f8.base.m_backend.data._M_elems[0xc] = local_728.base.m_backend.data._M_elems[0xc];
    local_3f8.base.m_backend.data._M_elems[0xd] = local_728.base.m_backend.data._M_elems[0xd];
    local_3f8.base.m_backend.data._M_elems[0xe] = local_728.base.m_backend.data._M_elems[0xe];
    local_3f8.base.m_backend.data._M_elems[0xf] = local_728.base.m_backend.data._M_elems[0xf];
    local_3f8.base.m_backend.exp = local_728.base.m_backend.exp;
    local_3f8.base.m_backend.neg = local_728.base.m_backend.neg;
    local_3f8.base.m_backend.fpclass = local_728.base.m_backend.fpclass;
    local_3f8.base.m_backend.prec_elem = local_728.base.m_backend.prec_elem;
    anon_unknown.dwarf_ef5b7::
    func<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
    ::operator()((autodiff_fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_1UL>
                  *)&v.v,&local_498,&local_3f8);
    for (uVar2 = 1; uVar2 != 0x101; uVar2 = uVar2 + 1) {
      boost::math::differentiation::autodiff_v1::detail::
      fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_1UL>
      ::derivative<int>(&local_628,
                        (fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_1UL>
                         *)&v.v,0);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_1UL>
      ::derivative<int>(&local_80,
                        (fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_1UL>
                         *)&v.v,1);
      ::operator/(vn.v._M_elems,&local_628,&local_80);
      ::operator-(&xn,&local_728,vn.v._M_elems);
      local_678.base.m_backend.data._M_elems[0] = xn.base.m_backend.data._M_elems[0];
      local_678.base.m_backend.data._M_elems[1] = xn.base.m_backend.data._M_elems[1];
      local_678.base.m_backend.data._M_elems[2] = xn.base.m_backend.data._M_elems[2];
      local_678.base.m_backend.data._M_elems[3] = xn.base.m_backend.data._M_elems[3];
      local_678.base.m_backend.data._M_elems[4] = xn.base.m_backend.data._M_elems[4];
      local_678.base.m_backend.data._M_elems[5] = xn.base.m_backend.data._M_elems[5];
      local_678.base.m_backend.data._M_elems[6] = xn.base.m_backend.data._M_elems[6];
      local_678.base.m_backend.data._M_elems[7] = xn.base.m_backend.data._M_elems[7];
      local_678.base.m_backend.data._M_elems[8] = xn.base.m_backend.data._M_elems[8];
      local_678.base.m_backend.data._M_elems[9] = xn.base.m_backend.data._M_elems[9];
      local_678.base.m_backend.data._M_elems[10] = xn.base.m_backend.data._M_elems[10];
      local_678.base.m_backend.data._M_elems[0xb] = xn.base.m_backend.data._M_elems[0xb];
      local_678.base.m_backend.data._M_elems[0xc] = xn.base.m_backend.data._M_elems[0xc];
      local_678.base.m_backend.data._M_elems[0xd] = xn.base.m_backend.data._M_elems[0xd];
      local_678.base.m_backend.data._M_elems[0xe] = xn.base.m_backend.data._M_elems[0xe];
      local_678.base.m_backend.data._M_elems[0xf] = xn.base.m_backend.data._M_elems[0xf];
      local_678.base.m_backend.exp = xn.base.m_backend.exp;
      local_678.base.m_backend.neg = xn.base.m_backend.neg;
      local_678.base.m_backend.fpclass = xn.base.m_backend.fpclass;
      local_678.base.m_backend.prec_elem = xn.base.m_backend.prec_elem;
      anon_unknown.dwarf_ef5b7::
      func<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
      ::operator()((autodiff_fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_1UL>
                    *)&vn.v,&local_498,&local_678);
      ::operator-(&local_80,&xn,&local_728);
      abs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
                (&local_628,&local_80);
      abs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
                (&local_170,&local_728);
      ::operator*(&local_120,2,&local_170);
      std::
      numeric_limits<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
      ::epsilon();
      ::operator*(&local_d0,&local_120,&local_1c0);
      tVar1 = boost::multiprecision::operator<(&local_628.base,&local_d0.base);
      if (tVar1) {
LAB_0012bb18:
        local_6d8.first.base.m_backend.data._M_elems[0xc] = xn.base.m_backend.data._M_elems[0xc];
        local_6d8.first.base.m_backend.data._M_elems[0xd] = xn.base.m_backend.data._M_elems[0xd];
        local_6d8.first.base.m_backend.data._M_elems[0xe] = xn.base.m_backend.data._M_elems[0xe];
        local_6d8.first.base.m_backend.data._M_elems[0xf] = xn.base.m_backend.data._M_elems[0xf];
        local_6d8.first.base.m_backend.data._M_elems[8] = xn.base.m_backend.data._M_elems[8];
        local_6d8.first.base.m_backend.data._M_elems[9] = xn.base.m_backend.data._M_elems[9];
        local_6d8.first.base.m_backend.data._M_elems[10] = xn.base.m_backend.data._M_elems[10];
        local_6d8.first.base.m_backend.data._M_elems[0xb] = xn.base.m_backend.data._M_elems[0xb];
        local_6d8.first.base.m_backend.data._M_elems[4] = xn.base.m_backend.data._M_elems[4];
        local_6d8.first.base.m_backend.data._M_elems[5] = xn.base.m_backend.data._M_elems[5];
        local_6d8.first.base.m_backend.data._M_elems[6] = xn.base.m_backend.data._M_elems[6];
        local_6d8.first.base.m_backend.data._M_elems[7] = xn.base.m_backend.data._M_elems[7];
        local_6d8.first.base.m_backend.data._M_elems[0] = xn.base.m_backend.data._M_elems[0];
        local_6d8.first.base.m_backend.data._M_elems[1] = xn.base.m_backend.data._M_elems[1];
        local_6d8.first.base.m_backend.data._M_elems[2] = xn.base.m_backend.data._M_elems[2];
        local_6d8.first.base.m_backend.data._M_elems[3] = xn.base.m_backend.data._M_elems[3];
        local_6d8.first.base.m_backend.exp = xn.base.m_backend.exp;
        local_6d8.first.base.m_backend.neg = xn.base.m_backend.neg;
        local_6d8.first.base.m_backend.fpclass = xn.base.m_backend.fpclass;
        local_6d8.first.base.m_backend.prec_elem = xn.base.m_backend.prec_elem;
        local_6d8.second = uVar2;
        goto LAB_0012bbe9;
      }
      boost::math::differentiation::autodiff_v1::detail::
      fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_1UL>
      ::derivative<int>(&local_260,
                        (fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_1UL>
                         *)&vn.v,0);
      abs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
                (&local_210,&local_260);
      std::
      numeric_limits<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
      ::epsilon();
      ::operator*(&local_2b0,2,&local_300);
      tVar1 = boost::multiprecision::operator<(&local_210.base,&local_2b0.base);
      if (tVar1) goto LAB_0012bb18;
      local_728.base.m_backend.data._M_elems[0xc] = xn.base.m_backend.data._M_elems[0xc];
      local_728.base.m_backend.data._M_elems[0xd] = xn.base.m_backend.data._M_elems[0xd];
      local_728.base.m_backend.data._M_elems[0xe] = xn.base.m_backend.data._M_elems[0xe];
      local_728.base.m_backend.data._M_elems[0xf] = xn.base.m_backend.data._M_elems[0xf];
      local_728.base.m_backend.data._M_elems[8] = xn.base.m_backend.data._M_elems[8];
      local_728.base.m_backend.data._M_elems[9] = xn.base.m_backend.data._M_elems[9];
      local_728.base.m_backend.data._M_elems[10] = xn.base.m_backend.data._M_elems[10];
      local_728.base.m_backend.data._M_elems[0xb] = xn.base.m_backend.data._M_elems[0xb];
      local_728.base.m_backend.data._M_elems[4] = xn.base.m_backend.data._M_elems[4];
      local_728.base.m_backend.data._M_elems[5] = xn.base.m_backend.data._M_elems[5];
      local_728.base.m_backend.data._M_elems[6] = xn.base.m_backend.data._M_elems[6];
      local_728.base.m_backend.data._M_elems[7] = xn.base.m_backend.data._M_elems[7];
      local_728.base.m_backend.data._M_elems[0] = xn.base.m_backend.data._M_elems[0];
      local_728.base.m_backend.data._M_elems[1] = xn.base.m_backend.data._M_elems[1];
      local_728.base.m_backend.data._M_elems[2] = xn.base.m_backend.data._M_elems[2];
      local_728.base.m_backend.data._M_elems[3] = xn.base.m_backend.data._M_elems[3];
      local_728.base.m_backend.exp = xn.base.m_backend.exp;
      local_728.base.m_backend.neg = xn.base.m_backend.neg;
      local_728.base.m_backend.fpclass = xn.base.m_backend.fpclass;
      local_728.base.m_backend.prec_elem = xn.base.m_backend.prec_elem;
      std::
      array<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
      ::operator=(&v.v,&vn.v);
    }
    vn.v._M_elems[0].base.m_backend.data._M_elems[0xc] = local_728.base.m_backend.data._M_elems[0xc]
    ;
    vn.v._M_elems[0].base.m_backend.data._M_elems[0xd] = local_728.base.m_backend.data._M_elems[0xd]
    ;
    vn.v._M_elems[0].base.m_backend.data._M_elems[0xe] = local_728.base.m_backend.data._M_elems[0xe]
    ;
    vn.v._M_elems[0].base.m_backend.data._M_elems[0xf] = local_728.base.m_backend.data._M_elems[0xf]
    ;
    vn.v._M_elems[0].base.m_backend.data._M_elems[8] = local_728.base.m_backend.data._M_elems[8];
    vn.v._M_elems[0].base.m_backend.data._M_elems[9] = local_728.base.m_backend.data._M_elems[9];
    vn.v._M_elems[0].base.m_backend.data._M_elems[10] = local_728.base.m_backend.data._M_elems[10];
    vn.v._M_elems[0].base.m_backend.data._M_elems[0xb] = local_728.base.m_backend.data._M_elems[0xb]
    ;
    vn.v._M_elems[0].base.m_backend.data._M_elems[4] = local_728.base.m_backend.data._M_elems[4];
    vn.v._M_elems[0].base.m_backend.data._M_elems[5] = local_728.base.m_backend.data._M_elems[5];
    vn.v._M_elems[0].base.m_backend.data._M_elems[6] = local_728.base.m_backend.data._M_elems[6];
    vn.v._M_elems[0].base.m_backend.data._M_elems[7] = local_728.base.m_backend.data._M_elems[7];
    vn.v._M_elems[0].base.m_backend.data._M_elems[0] = local_728.base.m_backend.data._M_elems[0];
    vn.v._M_elems[0].base.m_backend.data._M_elems[1] = local_728.base.m_backend.data._M_elems[1];
    vn.v._M_elems[0].base.m_backend.data._M_elems[2] = local_728.base.m_backend.data._M_elems[2];
    vn.v._M_elems[0].base.m_backend.data._M_elems[3] = local_728.base.m_backend.data._M_elems[3];
    vn.v._M_elems[0].base.m_backend.exp = local_728.base.m_backend.exp;
    vn.v._M_elems[0].base.m_backend.neg = local_728.base.m_backend.neg;
    vn.v._M_elems[0].base.m_backend.fpclass = local_728.base.m_backend.fpclass;
    vn.v._M_elems[0].base.m_backend.prec_elem = local_728.base.m_backend.prec_elem;
    vn.v._M_elems[1].base.m_backend.data._M_elems[0] = 0;
    std::
    pair<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_unsigned_long>
    ::
    pair<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_int,_true>
              (&local_6d8,
               (pair<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_int>
                *)&vn);
    if (local_6d8.second != 0) {
LAB_0012bbe9:
      ::operator/(__return_storage_ptr__,1,&local_6d8.first);
      return __return_storage_ptr__;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"convergence error");
    puVar4 = &std::runtime_error::typeinfo;
    pcVar3 = std::runtime_error::~runtime_error;
  }
  __cxa_throw(this_00,puVar4,pcVar3);
}

Assistant:

inline T square(T Jx, T Jy) {
  Jx = abs(Jx);
  Jy = abs(Jy);
  if (Jx * Jy <= 0) throw(std::invalid_argument("Jx * Jy should be non-zero"));
  auto result = standards::newton_1d(func<T>(Jx, Jy), 1 / (2 * (Jx + Jy)));
  if (!result.second) throw(std::runtime_error("convergence error"));
  return 1 / result.first;
}